

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeesPdu.cpp
# Opt level: O0

void __thiscall DIS::SeesPdu::SeesPdu(SeesPdu *this)

{
  SeesPdu *this_local;
  
  DistributedEmissionsFamilyPdu::DistributedEmissionsFamilyPdu
            (&this->super_DistributedEmissionsFamilyPdu);
  (this->super_DistributedEmissionsFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__SeesPdu_00272fe0;
  EntityID::EntityID(&this->_orginatingEntityID);
  this->_infraredSignatureRepresentationIndex = 0;
  this->_acousticSignatureRepresentationIndex = 0;
  this->_radarCrossSectionSignatureRepresentationIndex = 0;
  this->_numberOfPropulsionSystems = 0;
  this->_numberOfVectoringNozzleSystems = 0;
  std::vector<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>::vector
            (&this->_propulsionSystemData);
  std::vector<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>::
  vector(&this->_vectoringSystemData);
  Pdu::setPduType((Pdu *)this,'\x1e');
  return;
}

Assistant:

SeesPdu::SeesPdu() : DistributedEmissionsFamilyPdu(),
   _orginatingEntityID(), 
   _infraredSignatureRepresentationIndex(0), 
   _acousticSignatureRepresentationIndex(0), 
   _radarCrossSectionSignatureRepresentationIndex(0), 
   _numberOfPropulsionSystems(0), 
   _numberOfVectoringNozzleSystems(0)
{
    setPduType( 30 );
}